

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::RepeatedPrimitive::GeneratePrivateMembers
          (RepeatedPrimitive *this,Printer *p)

{
  bool bVar1;
  undefined8 uVar2;
  FieldDescriptor *field;
  char *pcVar3;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [32];
  AlphaNum local_160;
  Sub local_130;
  undefined8 local_78;
  char *local_70;
  AlphaNum local_48;
  
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    pcVar3 = "\n      $pbi$::RawPtr<$pb$::RepeatedField<$Type$>> $name$_;\n    ";
    uVar2 = 0x3f;
  }
  else {
    pcVar3 = "\n      $pb$::RepeatedField<$Type$> $name$_;\n    ";
    uVar2 = 0x30;
  }
  google::protobuf::io::Printer::Emit(p,0,0,uVar2,pcVar3);
  bVar1 = HasCachedSize(this);
  if (bVar1) {
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"_cached_size_","");
    local_160.piece_._M_len = 1;
    local_160.piece_._M_str = "_";
    FieldName_abi_cxx11_(&local_1a0,(cpp *)(this->super_FieldGeneratorBase).field_,field);
    local_48.piece_._M_len = local_1a0._M_string_length;
    local_48.piece_._M_str = local_1a0._M_dataplus._M_p;
    local_78 = 0x12;
    local_70 = "_cached_byte_size_";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_180,&local_160,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    io::Printer::Sub::Sub<std::__cxx11::string>
              (&local_130,&local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
    google::protobuf::io::Printer::Emit
              (p,&local_130,1,0x3e,
               "\n              $pbi$::CachedSize $_cached_size_$;\n            ");
    if (local_130.annotation_.
        super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
        _M_payload.
        super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
        .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged ==
        true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 &local_130.annotation_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.value_.consume_after._M_dataplus._M_p !=
        &local_130.value_.consume_after.field_2) {
      operator_delete(local_130.value_.consume_after._M_dataplus._M_p,
                      local_130.value_.consume_after.field_2._M_allocated_capacity + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr
      [local_130.value_.value.
       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
       .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       _M_index]._M_data)((anon_class_1_0_00000001 *)&local_160,&local_130.value_.value);
    local_130.value_.value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_index
         = 0xff;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.key_._M_dataplus._M_p != &local_130.key_.field_2) {
      operator_delete(local_130.key_._M_dataplus._M_p,
                      local_130.key_.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void RepeatedPrimitive::GeneratePrivateMembers(io::Printer* p) const {
  if (should_split()) {
    p->Emit(R"cc(
      $pbi$::RawPtr<$pb$::RepeatedField<$Type$>> $name$_;
    )cc");
  } else {
    p->Emit(R"cc(
      $pb$::RepeatedField<$Type$> $name$_;
    )cc");
  }

  if (HasCachedSize()) {
    p->Emit({{"_cached_size_", MakeVarintCachedSizeName(field_)}},
            R"cc(
              $pbi$::CachedSize $_cached_size_$;
            )cc");
  }
}